

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O2

NeuralNetwork * addSoftmaxLayer(Model *m,char *name,char *input,char *output)

{
  NeuralNetwork *pNVar1;
  NeuralNetworkLayer *this;
  
  pNVar1 = CoreML::Specification::Model::mutable_neuralnetwork(m);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar1->layers_);
  CoreML::Specification::NeuralNetworkLayer::set_name(this,name);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,input);
  CoreML::Specification::NeuralNetworkLayer::add_output(this,output);
  CoreML::Specification::NeuralNetworkLayer::mutable_softmax(this);
  return pNVar1;
}

Assistant:

Specification::NeuralNetwork* addSoftmaxLayer(Specification::Model& m, const char *name,  const char *input, const char *output) {
    
    auto neuralNet = m.mutable_neuralnetwork();
    auto softmaxLayer = neuralNet->add_layers();
    
    softmaxLayer->set_name(name);
    softmaxLayer->add_input(input);
    softmaxLayer->add_output(output);
    softmaxLayer->mutable_softmax();
    
    return neuralNet;
}